

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

void __thiscall ArrayType::GenArrayLength(ArrayType *this,Output *out_cc,Env *env,DataPtr *data)

{
  long lVar1;
  long lVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  char *pcVar9;
  ArrayType *in_RDX;
  Output *in_RSI;
  Type *in_RDI;
  string max_elements_available;
  char *array_ptr_expr;
  int element_size;
  ID *in_stack_fffffffffffffe68;
  ArrayType *in_stack_fffffffffffffe70;
  Output *in_stack_fffffffffffffe78;
  Expr *in_stack_fffffffffffffe80;
  Env *in_stack_fffffffffffffe88;
  ID *in_stack_fffffffffffffe90;
  Env *in_stack_fffffffffffffe98;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Output *pOVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 v;
  ID *in_stack_fffffffffffffed8;
  Env *in_stack_fffffffffffffee0;
  string local_88 [32];
  char *local_68;
  undefined1 local_5d;
  uint local_24;
  ArrayType *local_18;
  Output *local_10;
  
  v = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  arraylength_var(in_stack_fffffffffffffe70);
  bVar4 = Env::Evaluated(in_stack_fffffffffffffe88,(ID *)in_stack_fffffffffffffe80);
  if (!bVar4) {
    bVar4 = Type::incremental_parsing(in_RDI);
    if (((!bVar4) &&
        ((**(code **)(*(long *)&((in_RDI[1].type_decl_id_)->super_Object).filename + 0x38))
                   (in_RDI[1].type_decl_id_,local_10,local_18),
        lVar1._0_4_ = in_RDI[1].super_DataDepElement.dde_type_,
        lVar1._4_1_ = in_RDI[1].super_DataDepElement.in_traversal,
        lVar1._5_3_ = *(undefined3 *)&in_RDI[1].super_DataDepElement.field_0xd, lVar1 == 0)) &&
       ((in_RDI->attr_restofdata_ & 1U) == 0)) {
      (**(code **)(*(long *)&((in_RDI[1].type_decl_id_)->super_Object).filename + 0x40))
                (in_RDI[1].type_decl_id_,local_10,local_18);
    }
    pOVar10 = local_10;
    lVar2._0_4_ = in_RDI[1].super_DataDepElement.dde_type_;
    lVar2._4_1_ = in_RDI[1].super_DataDepElement.in_traversal;
    lVar2._5_3_ = *(undefined3 *)&in_RDI[1].super_DataDepElement.field_0xd;
    if (lVar2 == 0) {
      if ((in_RDI->attr_restofdata_ & 1U) != 0) {
        arraylength_var(local_18);
        pcVar6 = Env::LValue((Env *)local_18,in_stack_fffffffffffffe68);
        pcVar7 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        pcVar9 = DataPtr::ptr_expr((DataPtr *)0x122816);
        Output::println(local_10,"%s = (%s) - (%s);",pcVar6,pcVar7,pcVar9);
        arraylength_var(local_18);
        Env::SetEvaluated(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(bool)v);
      }
    }
    else {
      arraylength_var(in_stack_fffffffffffffe70);
      pcVar6 = Env::LValue((Env *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      pcVar7 = Expr::EvalExpr(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                              (Env *)in_stack_fffffffffffffe70);
      Output::println(pOVar10,"%s = %s;",pcVar6,pcVar7);
      arraylength_var(in_stack_fffffffffffffe70);
      Env::SetEvaluated(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(bool)v);
      pOVar10 = local_10;
      arraylength_var(in_stack_fffffffffffffe70);
      pcVar6 = Env::LValue((Env *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      Output::println(pOVar10,"if ( %s < 0 )",pcVar6);
      Output::inc_indent(local_10);
      Output::println(local_10,"{");
      pOVar10 = local_10;
      uVar8 = std::__cxx11::string::c_str();
      Output::println(pOVar10,"throw binpac::ExceptionOutOfBound(\"%s\",",uVar8);
      pOVar10 = local_10;
      arraylength_var(in_stack_fffffffffffffe70);
      pcVar6 = Env::LValue((Env *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      pcVar7 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      pcVar9 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      Output::println(pOVar10,"  %s, (%s) - (%s));",pcVar6,pcVar7,pcVar9);
      Output::println(local_10,"}");
      Output::dec_indent(local_10);
      pp_Var3 = in_RDI[1].super_DataDepElement._vptr_DataDepElement;
      iVar5 = (**(code **)(*pp_Var3 + 0x98))(pp_Var3,local_18);
      pOVar10 = local_10;
      if (iVar5 == -1) {
        uVar8 = std::__cxx11::string::c_str();
        Output::println(pOVar10,"// Check array element quantity: %s",uVar8);
        local_24 = 1;
      }
      else {
        uVar8 = std::__cxx11::string::c_str();
        Output::println(pOVar10,"// Check bounds for static-size array: %s",uVar8);
        (**(code **)(*in_RDI[1].super_DataDepElement._vptr_DataDepElement + 0xa0))();
        pp_Var3 = in_RDI[1].super_DataDepElement._vptr_DataDepElement;
        local_24 = (**(code **)(*pp_Var3 + 0x98))(pp_Var3,local_18);
        if (local_24 == 0) {
          local_5d = 1;
          uVar8 = __cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          Exception::Exception
                    ((Exception *)in_stack_fffffffffffffea0,(Object *)in_stack_fffffffffffffe98,
                     (string *)in_stack_fffffffffffffe90);
          local_5d = 0;
          __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
        }
      }
      local_68 = DataPtr::ptr_expr((DataPtr *)0x1225d1);
      pcVar6 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      strfmt_abi_cxx11_((char *)local_88,"((%s - %s) / %d)",pcVar6,local_68,(ulong)local_24);
      pOVar10 = local_10;
      arraylength_var(in_stack_fffffffffffffe70);
      pcVar6 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      uVar8 = std::__cxx11::string::c_str();
      Output::println(pOVar10,"if ( %s > %s )",pcVar6,uVar8);
      Output::inc_indent(local_10);
      pOVar10 = local_10;
      uVar8 = std::__cxx11::string::c_str();
      Output::println(pOVar10,"throw binpac::ExceptionOutOfBound(\"%s\",",uVar8);
      pOVar10 = local_10;
      arraylength_var(in_stack_fffffffffffffe70);
      pcVar6 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      pcVar7 = Env::RValue(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      Output::println(pOVar10,"  %s, (%s) - (%s));",pcVar6,pcVar7,local_68);
      Output::dec_indent(local_10);
      std::__cxx11::string::~string(local_88);
    }
  }
  return;
}

Assistant:

void ArrayType::GenArrayLength(Output* out_cc, Env* env, const DataPtr& data)
	{
	if ( env->Evaluated(arraylength_var()) )
		return;

	if ( ! incremental_parsing() )
		{
		arraylength_var_field_->GenTempDecls(out_cc, env);
		// This is about to get initialized below, don't initialize it twice.
		if ( ! length_ && ! attr_restofdata_ )
			arraylength_var_field_->GenInitCode(out_cc, env);
		}

	if ( length_ )
		{
		out_cc->println("%s = %s;", env->LValue(arraylength_var()), length_->EvalExpr(out_cc, env));

		env->SetEvaluated(arraylength_var());

		// Check negative array length
		out_cc->println("if ( %s < 0 )", env->LValue(arraylength_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		out_cc->println("throw binpac::ExceptionOutOfBound(\"%s\",", data_id_str_.c_str());
		out_cc->println("  %s, (%s) - (%s));", env->LValue(arraylength_var()),
		                env->RValue(end_of_data), env->RValue(begin_of_data));
		out_cc->println("}");
		out_cc->dec_indent();

		int element_size;

		if ( elemtype_->StaticSize(env) == -1 )
			{
			// Check for overlong array quantity.  We cap it at the maximum
			// array size (assume 1-byte elements * array length) as we can't
			// possibly store more elements.  e.g. this helps prevent
			// user-controlled length fields from causing an excessive
			// iteration and/or memory-allocation (for the array we'll be
			// parsing into) unless they actually sent enough data to go along
			// with it.  Note that this check is *not* looking for whether the
			// contents of the array will extend past the end of the data
			// buffer.
			out_cc->println("// Check array element quantity: %s", data_id_str_.c_str());
			element_size = 1;
			}
		else
			{
			// Boundary check the entire array if elements have static size.
			out_cc->println("// Check bounds for static-size array: %s", data_id_str_.c_str());
			elemtype_->SetBoundaryChecked();
			element_size = elemtype_->StaticSize(env);

			if ( element_size == 0 )
				{
				// If we know we have an array of empty elements, probably
				// better to structure the parser as just a single empty
				// field to avoid DoS vulnerability of allocating
				// arbitrary number of empty records (i.e. cheap for them,
				// but costly for us unless we have special optimization
				// for this scenario to forgo the usual allocation).
				throw Exception(
					this, "using an array of known-to-be-empty elements is possibly a bad idea");
				}
			}

		const char* array_ptr_expr = data.ptr_expr();
		string max_elements_available = strfmt("((%s - %s) / %d)", env->RValue(end_of_data),
		                                       array_ptr_expr, element_size);

		out_cc->println("if ( %s > %s )", env->RValue(arraylength_var()),
		                max_elements_available.c_str());
		out_cc->inc_indent();
		out_cc->println("throw binpac::ExceptionOutOfBound(\"%s\",", data_id_str_.c_str());
		out_cc->println("  %s, (%s) - (%s));", env->RValue(arraylength_var()),
		                env->RValue(end_of_data), array_ptr_expr);
		out_cc->dec_indent();
		}
	else if ( attr_restofdata_ )
		{
		ASSERT(elemtype_->StaticSize(env) == 1);
		out_cc->println("%s = (%s) - (%s);", env->LValue(arraylength_var()),
		                env->RValue(end_of_data), data.ptr_expr());
		env->SetEvaluated(arraylength_var());
		}
	}